

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateRecorder::Impl::copy_compute_pipeline
          (Impl *this,VkComputePipelineCreateInfo *create_info,ScratchAllocator *alloc,
          VkPipeline *base_pipelines,uint32_t base_pipeline_count,VkDevice device,
          PFN_vkGetShaderModuleCreateInfoIdentifierEXT gsmcii,
          VkComputePipelineCreateInfo **out_create_info)

{
  bool bVar1;
  VkComputePipelineCreateInfo *info_00;
  VkPipelineCreateFlags2KHR VVar2;
  VkPipelineCreateFlags2CreateInfo *pVVar3;
  size_t sVar4;
  char *pcVar5;
  VkComputePipelineCreateInfo *info;
  VkDevice device_local;
  uint32_t base_pipeline_count_local;
  VkPipeline *base_pipelines_local;
  ScratchAllocator *alloc_local;
  VkComputePipelineCreateInfo *create_info_local;
  Impl *this_local;
  
  info_00 = copy<VkComputePipelineCreateInfo>(this,create_info,1,alloc);
  VVar2 = normalize_pipeline_creation_flags((ulong)info_00->flags);
  info_00->flags = (VkPipelineCreateFlags)VVar2;
  pVVar3 = find_pnext<VkPipelineCreateFlags2CreateInfo>
                     (VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO,info_00->pNext);
  if (pVVar3 != (VkPipelineCreateFlags2CreateInfo *)0x0) {
    info_00->flags = 0;
  }
  bVar1 = update_derived_pipeline<VkComputePipelineCreateInfo>
                    (info_00,base_pipelines,base_pipeline_count);
  if (bVar1) {
    if (((info_00->stage).pSpecializationInfo == (VkSpecializationInfo *)0x0) ||
       (bVar1 = copy_specialization_info
                          (this,(info_00->stage).pSpecializationInfo,alloc,
                           &(info_00->stage).pSpecializationInfo), bVar1)) {
      pcVar5 = (info_00->stage).pName;
      sVar4 = strlen((info_00->stage).pName);
      pcVar5 = copy<char>(this,pcVar5,sVar4 + 1,alloc);
      (info_00->stage).pName = pcVar5;
      bVar1 = copy_pnext_chain(this,(info_00->stage).pNext,alloc,&(info_00->stage).pNext,
                               (DynamicStateInfo *)0x0,0);
      if (bVar1) {
        bVar1 = add_module_identifier(&info_00->stage,alloc,device,gsmcii);
        if (bVar1) {
          bVar1 = copy_pnext_chain(this,info_00->pNext,alloc,&info_00->pNext,(DynamicStateInfo *)0x0
                                   ,0);
          if (bVar1) {
            *out_create_info = info_00;
            this_local._7_1_ = true;
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool StateRecorder::Impl::copy_compute_pipeline(const VkComputePipelineCreateInfo *create_info, ScratchAllocator &alloc,
                                                const VkPipeline *base_pipelines, uint32_t base_pipeline_count,
                                                VkDevice device, PFN_vkGetShaderModuleCreateInfoIdentifierEXT gsmcii,
                                                VkComputePipelineCreateInfo **out_create_info)
{
	auto *info = copy(create_info, 1, alloc);
	info->flags = normalize_pipeline_creation_flags(info->flags);
	if (find_pnext<VkPipelineCreateFlags2CreateInfoKHR>(VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO_KHR, info->pNext))
		info->flags = 0;

	if (!update_derived_pipeline(info, base_pipelines, base_pipeline_count))
		return false;

	if (info->stage.pSpecializationInfo)
		if (!copy_specialization_info(info->stage.pSpecializationInfo, alloc, &info->stage.pSpecializationInfo))
			return false;

	info->stage.pName = copy(info->stage.pName, strlen(info->stage.pName) + 1, alloc);

	if (!copy_pnext_chain(info->stage.pNext, alloc, &info->stage.pNext, nullptr, 0))
		return false;

	if (!add_module_identifier(&info->stage, alloc, device, gsmcii))
		return false;

	if (!copy_pnext_chain(info->pNext, alloc, &info->pNext, nullptr, 0))
		return false;

	*out_create_info = info;
	return true;
}